

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall diy::AMRLink::Description::Description(Description *this)

{
  undefined4 *in_RDI;
  DynamicPoint<int,_4UL> *in_stack_00000020;
  initializer_list<int> in_stack_00000028;
  int dim;
  Bounds<int> *in_stack_ffffffffffffffd0;
  undefined4 local_1c;
  undefined4 *local_18;
  undefined8 local_10;
  
  *in_RDI = 0xffffffff;
  local_1c = 0;
  local_18 = &local_1c;
  local_10 = 1;
  DynamicPoint<int,_4UL>::DynamicPoint(in_stack_00000020,in_stack_00000028);
  dim = (int)((ulong)(in_RDI + 0x12) >> 0x20);
  Bounds<int>::Bounds(in_stack_ffffffffffffffd0,dim);
  Bounds<int>::Bounds(in_stack_ffffffffffffffd0,dim);
  return;
}

Assistant:

Description() = default;